

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfstrmatrix.cpp
# Opt level: O1

TPZStructMatrix * __thiscall
TPZFStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>::Clone
          (TPZFStructMatrix<double,_TPZStructMatrixTBBFlow<double>_> *this)

{
  long lVar1;
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0xc0);
  *(undefined ***)this_00 = &PTR__TPZSavable_019ce5f0;
  lVar1 = *(long *)(*(long *)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix + -0x60);
  *(undefined8 *)(this_00 + 1) = 0x19ce488;
  *(undefined8 *)this_00 = 0x19ce550;
  *(undefined4 *)&this_00[1].fMesh =
       *(undefined4 *)
        ((long)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh + lVar1);
  *(undefined1 *)((long)&this_00[1].fMesh + 4) =
       *(undefined1 *)
        ((long)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh + lVar1 + 4);
  TPZStructMatrix::TPZStructMatrix
            (this_00,&PTR_construction_vtable_104__019cddb0,(TPZStructMatrix *)this);
  *(undefined8 *)this_00 = 0x19cde88;
  *(undefined8 *)(this_00 + 1) = 0x19cdf68;
  TPZStructMatrixTBBFlow<double>::TPZStructMatrixTBBFlow
            ((TPZStructMatrixTBBFlow<double> *)&this_00->field_0xa0,
             &PTR_construction_vtable_104__019cddd8,
             (TPZStructMatrixTBBFlow<double> *)
             &(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.field_0xa0);
  *(undefined8 *)this_00 = 0x19cdb78;
  *(undefined8 *)(this_00 + 1) = 0x19cdd30;
  *(undefined8 *)&this_00->field_0xa0 = 0x19cdc38;
  return this_00;
}

Assistant:

TPZStructMatrix * TPZFStructMatrix<TVar,TPar>::Clone(){
    return new TPZFStructMatrix(*this);
}